

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredNoChangeTest_Test::
ComparisonTest_IgnoredNoChangeTest_Test(ComparisonTest_IgnoredNoChangeTest_Test *this)

{
  ComparisonTest_IgnoredNoChangeTest_Test *this_local;
  
  ComparisonTest::ComparisonTest(&this->super_ComparisonTest);
  (this->super_ComparisonTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ComparisonTest_IgnoredNoChangeTest_Test_02a26808;
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredNoChangeTest) {
  proto1diff_.set_v(3);
  proto2diff_.set_v(3);
  proto2diff_.set_w("foo");

  ignore_field("v");

  EXPECT_EQ(
      "ignored: v\n"
      "added: w: \"foo\"\n",
      RunDiff());
}